

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveArea.cpp
# Opt level: O0

void __thiscall CDirectiveAutoRegion::writeTempData(CDirectiveAutoRegion *this,TempData *tempData)

{
  int64_t memoryAddress;
  long lVar1;
  long lVar2;
  TempData *this_00;
  pointer pCVar3;
  allocator<char> local_69;
  string local_68;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CDirectiveAutoRegion *this_local;
  
  memoryAddress = this->position;
  local_18 = tempData;
  tempData_local = (TempData *)this;
  tinyformat::format<long>(&local_38,".autoregion 0x%08X",&this->position);
  TempData::writeLine(tempData,memoryAddress,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  CAssemblerCommand::applyFileInfo(pCVar3);
  pCVar3 = std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator->
                     (&this->content);
  (*pCVar3->_vptr_CAssemblerCommand[4])(pCVar3,local_18);
  this_00 = local_18;
  lVar1 = this->position;
  lVar2 = this->contentSize;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,".endautoregion",&local_69)
  ;
  TempData::writeLine(this_00,lVar1 + lVar2,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void CDirectiveAutoRegion::writeTempData(TempData& tempData) const
{
	tempData.writeLine(position,tfm::format(".autoregion 0x%08X",position));
	content->applyFileInfo();
	content->writeTempData(tempData);
	tempData.writeLine(position+contentSize,".endautoregion");
}